

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O0

Vec_Int_t * Acb_NtkCollectUser(Acb_Ntk_t *p,Vec_Ptr_t *vUser)

{
  int iVar1;
  Acb_ObjType_t AVar2;
  int iVar3;
  Vec_Int_t *p_00;
  Abc_Nam_t *p_01;
  Vec_Int_t *p_02;
  char *pName;
  int iLit;
  Vec_Int_t *vMap;
  Vec_Int_t *vRes;
  int i;
  char *pTemp;
  Vec_Ptr_t *vUser_local;
  Acb_Ntk_t *p_local;
  
  iVar1 = Vec_PtrSize(vUser);
  p_00 = Vec_IntAlloc(iVar1);
  p_01 = Acb_NtkNam(p);
  iVar1 = Abc_NamObjNumMax(p_01);
  p_02 = Vec_IntStart(iVar1);
  for (vRes._4_4_ = 1; iVar1 = Vec_StrSize(&p->vObjType), vRes._4_4_ < iVar1;
      vRes._4_4_ = vRes._4_4_ + 1) {
    AVar2 = Acb_ObjType(p,vRes._4_4_);
    if (((AVar2 != ABC_OPER_NONE) && (iVar1 = Acb_ObjIsCio(p,vRes._4_4_), iVar1 == 0)) &&
       (iVar1 = Acb_ObjName(p,vRes._4_4_), 0 < iVar1)) {
      iVar1 = Acb_ObjName(p,vRes._4_4_);
      iVar3 = Acb_ObjCopy(p,vRes._4_4_);
      Vec_IntWriteEntry(p_02,iVar1,iVar3);
    }
  }
  for (vRes._4_4_ = 0; iVar1 = Vec_PtrSize(vUser), vRes._4_4_ < iVar1; vRes._4_4_ = vRes._4_4_ + 1)
  {
    pName = (char *)Vec_PtrEntry(vUser,vRes._4_4_);
    iVar1 = Acb_NtkStrId(p,pName);
    iVar3 = Vec_IntSize(p_02);
    if (iVar1 < iVar3) {
      iVar1 = Acb_NtkStrId(p,pName);
      iVar1 = Vec_IntEntry(p_02,iVar1);
      if (iVar1 < 1) {
        __assert_fail("iLit > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                      ,0x268,"Vec_Int_t *Acb_NtkCollectUser(Acb_Ntk_t *, Vec_Ptr_t *)");
      }
      iVar1 = Abc_Lit2Var(iVar1);
      Vec_IntPush(p_00,iVar1);
    }
  }
  iVar1 = Vec_IntSize(p_00);
  iVar3 = Vec_PtrSize(vUser);
  if (iVar1 == iVar3) {
    Vec_IntFree(p_02);
    Vec_IntUniqify(p_00);
    return p_00;
  }
  __assert_fail("Vec_IntSize(vRes) == Vec_PtrSize(vUser)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                ,0x26c,"Vec_Int_t *Acb_NtkCollectUser(Acb_Ntk_t *, Vec_Ptr_t *)");
}

Assistant:

Vec_Int_t * Acb_NtkCollectUser( Acb_Ntk_t * p, Vec_Ptr_t * vUser )
{
    char * pTemp; int i;
    Vec_Int_t * vRes = Vec_IntAlloc( Vec_PtrSize(vUser) );
    Vec_Int_t * vMap = Vec_IntStart( Abc_NamObjNumMax(Acb_NtkNam(p)) );
    Acb_NtkForEachNode( p, i )
        if ( Acb_ObjName(p, i) > 0 )
            Vec_IntWriteEntry( vMap, Acb_ObjName(p, i), Acb_ObjCopy(p, i) );
    Vec_PtrForEachEntry( char *, vUser, pTemp, i )
        if ( Acb_NtkStrId(p, pTemp) < Vec_IntSize(vMap) )
        {
            int iLit = Vec_IntEntry( vMap, Acb_NtkStrId(p, pTemp) );
            assert( iLit > 0 );
            //printf( "Obj = %3d  Name = %3d  Copy = %3d\n", i, Acb_NtkStrId(p, pTemp), iLit );
            Vec_IntPush( vRes, Abc_Lit2Var(iLit) );
        }
    assert( Vec_IntSize(vRes) == Vec_PtrSize(vUser) );
    Vec_IntFree( vMap );
    Vec_IntUniqify( vRes );
    return vRes;
}